

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O0

c_int is_dual_infeasible(OSQPWorkspace *work,c_float eps_dual_inf)

{
  double *pdVar1;
  long *in_RDI;
  double in_XMM0_Qa;
  c_float cVar2;
  c_float cost_scaling;
  c_float norm_delta_x;
  c_int i;
  double local_30;
  double local_28;
  long local_20;
  
  if ((*(long *)(in_RDI[0x17] + 0x10) == 0) || (*(long *)(in_RDI[0x17] + 0x90) != 0)) {
    local_28 = vec_norm_inf((c_float *)in_RDI[0x11],*(c_int *)*in_RDI);
    local_30 = 1.0;
  }
  else {
    local_28 = vec_scaled_norm_inf(*(c_float **)(in_RDI[0x18] + 8),(c_float *)in_RDI[0x11],
                                   *(c_int *)*in_RDI);
    local_30 = *(double *)in_RDI[0x18];
  }
  if ((in_XMM0_Qa < local_28) &&
     (cVar2 = vec_prod(*(c_float **)(*in_RDI + 0x20),(c_float *)in_RDI[0x11],*(c_int *)*in_RDI),
     cVar2 < -local_30 * in_XMM0_Qa * local_28)) {
    mat_vec(*(csc **)(*in_RDI + 0x10),(c_float *)in_RDI[0x11],(c_float *)in_RDI[0x12],0);
    mat_tpose_vec(*(csc **)(*in_RDI + 0x10),(c_float *)in_RDI[0x11],(c_float *)in_RDI[0x12],1,1);
    if ((*(long *)(in_RDI[0x17] + 0x10) != 0) && (*(long *)(in_RDI[0x17] + 0x90) == 0)) {
      vec_ew_prod(*(c_float **)(in_RDI[0x18] + 0x20),(c_float *)in_RDI[0x12],(c_float *)in_RDI[0x12]
                  ,*(c_int *)*in_RDI);
    }
    cVar2 = vec_norm_inf((c_float *)in_RDI[0x12],*(c_int *)*in_RDI);
    if (cVar2 < local_30 * in_XMM0_Qa * local_28) {
      mat_vec(*(csc **)(*in_RDI + 0x18),(c_float *)in_RDI[0x11],(c_float *)in_RDI[0x13],0);
      if ((*(long *)(in_RDI[0x17] + 0x10) != 0) && (*(long *)(in_RDI[0x17] + 0x90) == 0)) {
        vec_ew_prod(*(c_float **)(in_RDI[0x18] + 0x28),(c_float *)in_RDI[0x13],
                    (c_float *)in_RDI[0x13],*(c_int *)(*in_RDI + 8));
      }
      local_20 = 0;
      while( true ) {
        if (*(long *)(*in_RDI + 8) <= local_20) {
          return 1;
        }
        pdVar1 = (double *)(*(long *)(*in_RDI + 0x30) + local_20 * 8);
        if (((*pdVar1 <= 1e+26 && *pdVar1 != 1e+26) &&
            (in_XMM0_Qa * local_28 < *(double *)(in_RDI[0x13] + local_20 * 8))) ||
           ((-1e+26 < *(double *)(*(long *)(*in_RDI + 0x28) + local_20 * 8) &&
            (*(double *)(in_RDI[0x13] + local_20 * 8) < -in_XMM0_Qa * local_28)))) break;
        local_20 = local_20 + 1;
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

c_int is_dual_infeasible(OSQPWorkspace *work, c_float eps_dual_inf) {
  // This function checks for the scaled dual infeasibility termination
  // criteria.
  //
  // 1) q * delta_x < - eps * || delta_x ||
  //
  // 2) ||P * delta_x || < eps * || delta_x ||
  //
  // 3) -> (A * delta_x)_i > -eps * || delta_x ||,    l_i != -inf
  //    -> (A * delta_x)_i <  eps * || delta_x ||,    u_i != inf
  //


  c_int   i; // Index for loops
  c_float norm_delta_x;
  c_float cost_scaling;

  // Compute norm of delta_x
  if (work->settings->scaling && !work->settings->scaled_termination) { // Unscale
                                                                        // if
                                                                        // necessary
    norm_delta_x = vec_scaled_norm_inf(work->scaling->D,
                                       work->delta_x,
                                       work->data->n);
    cost_scaling = work->scaling->c;
  } else {
    norm_delta_x = vec_norm_inf(work->delta_x, work->data->n);
    cost_scaling = 1.0;
  }

  // Prevent 0 division || delta_x || > 0
  if (norm_delta_x > eps_dual_inf) {
    // Normalize delta_x by its norm

    /* vec_mult_scalar(work->delta_x, 1./norm_delta_x, work->data->n); */

    // Check first if q'*delta_x < 0
    if (vec_prod(work->data->q, work->delta_x, work->data->n) <
        -cost_scaling * eps_dual_inf * norm_delta_x) {
      // Compute product P * delta_x (NB: P is store in upper triangular form)
      mat_vec(work->data->P, work->delta_x, work->Pdelta_x, 0);
      mat_tpose_vec(work->data->P, work->delta_x, work->Pdelta_x, 1, 1);

      // Scale if necessary
      if (work->settings->scaling && !work->settings->scaled_termination) {
        vec_ew_prod(work->scaling->Dinv,
                    work->Pdelta_x,
                    work->Pdelta_x,
                    work->data->n);
      }

      // Check if || P * delta_x || = 0
      if (vec_norm_inf(work->Pdelta_x, work->data->n) <
          cost_scaling * eps_dual_inf * norm_delta_x) {
        // Compute A * delta_x
        mat_vec(work->data->A, work->delta_x, work->Adelta_x, 0);

        // Scale if necessary
        if (work->settings->scaling && !work->settings->scaled_termination) {
          vec_ew_prod(work->scaling->Einv,
                      work->Adelta_x,
                      work->Adelta_x,
                      work->data->m);
        }

        // De Morgan Law Applied to dual infeasibility conditions for A * x
        // NB: Note that MIN_SCALING is used to adjust the infinity value
        //     in case the problem is scaled.
        for (i = 0; i < work->data->m; i++) {
          if (((work->data->u[i] < OSQP_INFTY * MIN_SCALING) &&
               (work->Adelta_x[i] >  eps_dual_inf * norm_delta_x)) ||
              ((work->data->l[i] > -OSQP_INFTY * MIN_SCALING) &&
               (work->Adelta_x[i] < -eps_dual_inf * norm_delta_x))) {
            // At least one condition not satisfied -> not dual infeasible
            return 0;
          }
        }

        // All conditions passed -> dual infeasible
        return 1;
      }
    }
  }

  // Conditions not satisfied -> not dual infeasible
  return 0;
}